

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_Bool tt_check_single_notdef(FT_Face ttface)

{
  int iVar1;
  char local_48 [8];
  char buf [8];
  FT_Error error;
  FT_UInt count;
  FT_ULong glyph_index;
  FT_ULong i;
  TT_Face pTStack_20;
  FT_UInt asize;
  TT_Face face;
  FT_Face pFStack_10;
  FT_Bool result;
  FT_Face ttface_local;
  
  face._7_1_ = '\0';
  _error = 0;
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  pTStack_20 = (TT_Face)ttface;
  pFStack_10 = ttface;
  for (glyph_index = 0; glyph_index < pTStack_20->num_locations; glyph_index = glyph_index + 1) {
    tt_face_get_location(pTStack_20,(FT_UInt)glyph_index,(FT_UInt *)((long)&i + 4));
    if (i._4_4_ != 0) {
      buf._4_4_ = buf._4_4_ + 1;
      if (1 < (uint)buf._4_4_) break;
      _error = glyph_index;
    }
  }
  if (buf._4_4_ == 1) {
    if (_error == 0) {
      face._7_1_ = '\x01';
    }
    else {
      buf._0_4_ = FT_Get_Glyph_Name(pFStack_10,(FT_UInt)_error,local_48,8);
      if (((buf._0_4_ == 0) && (local_48[0] == '.')) &&
         (iVar1 = strncmp(local_48,".notdef",8), iVar1 == 0)) {
        face._7_1_ = '\x01';
      }
    }
  }
  return face._7_1_;
}

Assistant:

static FT_Bool
  tt_check_single_notdef( FT_Face  ttface )
  {
    FT_Bool   result = FALSE;

    TT_Face   face = (TT_Face)ttface;
    FT_UInt   asize;
    FT_ULong  i;
    FT_ULong  glyph_index = 0;
    FT_UInt   count       = 0;


    for( i = 0; i < face->num_locations; i++ )
    {
      tt_face_get_location( face, i, &asize );
      if ( asize > 0 )
      {
        count += 1;
        if ( count > 1 )
          break;
        glyph_index = i;
      }
    }

    /* Only have a single outline. */
    if ( count == 1 )
    {
      if ( glyph_index == 0 )
        result = TRUE;
      else
      {
        /* FIXME: Need to test glyphname == .notdef ? */
        FT_Error error;
        char buf[8];


        error = FT_Get_Glyph_Name( ttface, glyph_index, buf, 8 );
        if ( !error                                            &&
             buf[0] == '.' && !ft_strncmp( buf, ".notdef", 8 ) )
          result = TRUE;
      }
    }

    return result;
  }